

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O3

int ztlex_next_token(ztlex_t *lex,ztlextok_t *token,ztlexinf_t **info)

{
  int iVar1;
  int iVar2;
  ztlextok_t zVar3;
  ushort **ppuVar4;
  long lVar5;
  
  *info = (ztlexinf_t *)0x0;
  while( true ) {
    do {
      iVar1 = (*lex->getC)(lex);
      if (iVar1 == -1) {
        return 0;
      }
      ppuVar4 = __ctype_b_loc();
    } while ((*(byte *)((long)*ppuVar4 + (long)iVar1 * 2 + 1) & 0x20) != 0);
    (*lex->ungetC)(iVar1,lex);
    iVar1 = (*lex->getC)(lex);
    if (iVar1 != 0x2f) break;
    iVar2 = (*lex->getC)(lex);
    if (iVar2 != 0x2f) {
      iVar1 = 0x2f;
      if (iVar2 != -1) {
        (*lex->ungetC)(iVar2,lex);
      }
      goto LAB_001035fb;
    }
    do {
      iVar1 = (*lex->getC)(lex);
    } while (iVar1 != 10);
    (*lex->ungetC)(10,lex);
  }
  if (iVar1 == -1) {
    return 0;
  }
LAB_001035fb:
  (*lex->ungetC)(iVar1,lex);
  lVar5 = 8;
  do {
    iVar1 = (**(code **)((long)&ztlex_selftest::cases[0x33].newCursorPos + lVar5))(lex);
    if (iVar1 != 0) {
      if (iVar1 != -1) {
        *token = *(ztlextok_t *)((long)&ztlex_next_token::map[0].fn + lVar5);
        iVar2 = lex->column;
        (lex->info).line = lex->line;
        (lex->info).column = iVar2 - iVar1;
        (lex->info).length = iVar1;
        memcpy((lex->info).lexeme,lex->lexeme,(long)(iVar1 + 1));
        *info = &lex->info;
        return 1;
      }
      return 0;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x68);
  iVar1 = (*lex->getC)(lex);
  if (iVar1 < 0x5b) {
    switch(iVar1) {
    case 0x28:
      zVar3 = 9;
      break;
    case 0x29:
      zVar3 = 10;
      break;
    case 0x2a:
      zVar3 = 3;
      break;
    case 0x2b:
      zVar3 = 1;
      break;
    case 0x2c:
      zVar3 = 0x13;
      break;
    case 0x2d:
      zVar3 = 2;
      break;
    case 0x2f:
      zVar3 = 4;
      break;
    case 0x3b:
      zVar3 = 6;
      break;
    case 0x3d:
      zVar3 = 5;
      break;
    default:
      if (iVar1 == -1) {
        return 0;
      }
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3c:
switchD_00103656_caseD_2e:
      ztlex_next_token_cold_1();
      return 0;
    }
  }
  else if (iVar1 < 0x7b) {
    if (iVar1 == 0x5b) {
      zVar3 = 0x11;
    }
    else {
      if (iVar1 != 0x5d) goto switchD_00103656_caseD_2e;
      zVar3 = 0x12;
    }
  }
  else if (iVar1 == 0x7b) {
    zVar3 = 0xf;
  }
  else {
    if (iVar1 != 0x7d) goto switchD_00103656_caseD_2e;
    zVar3 = 0x10;
  }
  *token = zVar3;
  iVar1 = lex->column;
  (lex->info).line = lex->line;
  (lex->info).column = iVar1 + -1;
  (lex->info).length = 0;
  *info = &lex->info;
  return 1;
}

Assistant:

int ztlex_next_token(ztlex_t     *lex,
                     ztlextok_t  *token,
               const ztlexinf_t **info)
{
  static const struct
  {
    int        (*fn)(ztlex_t *);
    ztlextok_t token;
  }
  map[] =
  {
    { ztlex_isdollarhex, ZTTOKEN_DOLLARHEX },
    { ztlex_ishex,       ZTTOKEN_HEX       },
    { ztlex_isdecimal,   ZTTOKEN_DECIMAL   },
    { ztlex_isinteger,   ZTTOKEN_INT       },
    { ztlex_isnil,       ZTTOKEN_NIL       },
    { ztlex_isname,      ZTTOKEN_NAME      },
  };

  int c;
  int i;

  assert(lex);
  assert(token);
  assert(info);

  *info = NULL;

again:
  /* absorb all leading whitespace */
  do
  {
    c = lex->getC(lex);
    if (c == EOF)
      return 0;
  }
  while (isspace(c));

  lex->ungetC(c, lex);

  /* absorb comments */
  {
    c = lex->getC(lex);
    if (c == EOF)
      return 0;

    if (c != '/')
    {
      lex->ungetC(c, lex);
      goto notcomment;
    }

    c = lex->getC(lex);
    if (c != '/') /* including EOF */
    {
      if (c != EOF)
        lex->ungetC(c, lex);
      lex->ungetC('/', lex);
      goto notcomment;
    }

    /* we've found '//' - absorb the remainder of the line */
    do
      c = lex->getC(lex);
    while (c != '\n');

    if (c != EOF)
      lex->ungetC(c, lex);

    goto again;
  }

notcomment:
  /* try the complex tokens first */
  for (i = 0; i < (int) NELEMS(map); i++)
  {
    int len;

    len = map[i].fn(lex);
    if (len == EOF)
    {
      return 0;
    }
    else if (len)
    {
      *token = map[i].token;

      lex->info.line   = lex->line;
      lex->info.column = lex->column - len; /* report start of token */
      lex->info.length = len;
      memcpy(&lex->info.lexeme[0], lex->lexeme, len + 1);
      *info = &lex->info;
      return 1;
    }
  }

  /* deal with basic tokens */
  c = lex->getC(lex);
  switch (c)
  {
    case '(': *token = ZTTOKEN_LPAREN;    break;
    case ')': *token = ZTTOKEN_RPAREN;    break;
    case '*': *token = ZTTOKEN_TIMES;     break;
    case '+': *token = ZTTOKEN_PLUS;      break;
    case ',': *token = ZTTOKEN_COMMA;     break;
    case '-': *token = ZTTOKEN_MINUS;     break;
    case '/': *token = ZTTOKEN_DIVIDE;    break;
    case ';': *token = ZTTOKEN_SEMICOLON; break;
    case '=': *token = ZTTOKEN_EQUALS;    break;
    case '[': *token = ZTTOKEN_LSQBRA;    break;
    case ']': *token = ZTTOKEN_RSQBRA;    break;
    case '{': *token = ZTTOKEN_LBRACE;    break;
    case '}': *token = ZTTOKEN_RBRACE;    break;
    default:
      if (c != EOF) {
        lex->ungetC(c, lex);
        fprintf(stderr, "Unknown token '%c' at line %d column %d\n", c, lex->line, lex->column);
      }
      return 0;
  }

  lex->info.line   = lex->line;
  lex->info.column = lex->column - 1; /* report start of token */
  lex->info.length = 0; /* FIXME: Should basic tokens have any length? */
  *info = &lex->info;
  return 1;
}